

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NIVS.cpp
# Opt level: O1

void __thiscall
OpenMD::RNEMD::NIVSMethod::NIVSMethod(NIVSMethod *this,SimInfo *info,ForceManager *forceMan)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  RNEMDFluxType RVar4;
  RNEMDParameters *pRVar5;
  bool bVar6;
  double *pdVar7;
  byte bVar8;
  byte bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  vector<double,_std::allocator<double>_> momentumFluxVector;
  vector<double,_std::allocator<double>_> local_58;
  double local_38;
  
  RNEMD::RNEMD(&this->super_RNEMD,info,forceMan);
  (this->super_RNEMD)._vptr_RNEMD = (_func_int **)&PTR__RNEMD_0030e678;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_RNEMD).rnemdMethodLabel_,0,
             (char *)(this->super_RNEMD).rnemdMethodLabel_._M_string_length,0x2a334e);
  pRVar5 = info->simParams_->rnemdPars_;
  bVar2 = (pRVar5->KineticFlux).super_ParameterBase.empty_;
  bVar3 = (pRVar5->MomentumFlux).super_ParameterBase.empty_;
  RVar4 = (this->super_RNEMD).rnemdFluxType_;
  if (RVar4 < rnemdKePvector) {
    bVar9 = bVar2 ^ 1;
    bVar8 = bVar9;
    if ((7U >> (RVar4 & (rnemdKePvector|rnemdKePy)) & 1) == 0) {
      bVar8 = bVar3 ^ 1;
      if ((0x38U >> (RVar4 & (rnemdKePvector|rnemdKePy)) & 1) != 0) {
        bVar6 = false;
        goto LAB_0027214b;
      }
      if ((0xc000U >> (RVar4 & (rnemdKePvector|rnemdKePy)) & 1) == 0) goto LAB_00272291;
      bVar8 = bVar9 & bVar8;
    }
    bVar6 = false;
  }
  else {
LAB_00272291:
    bVar6 = true;
    bVar8 = 0;
  }
LAB_0027214b:
  if (bVar6) {
    snprintf(painCave.errMsg,2000,
             "RNEMD: The current method,\n\t\tNIVS\n\tcannot be used with the current flux type, %s\n"
             ,(this->super_RNEMD).rnemdFluxTypeLabel_._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if (bVar8 == 0) {
    snprintf(painCave.errMsg,2000,
             "RNEMD: The current method, NIVS, and flux type, %s,\n\tdid not have the correct flux value specified. Options\n\tinclude: kineticFlux and momentumFlux.\n"
             ,(this->super_RNEMD).rnemdFluxTypeLabel_._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  uVar10 = 0;
  uVar11 = 0;
  if (bVar2 == false) {
    dVar1 = (pRVar5->KineticFlux).data_;
    uVar10 = SUB84(dVar1,0);
    uVar11 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  RNEMD::setKineticFlux(&this->super_RNEMD,(RealType)CONCAT44(uVar11,uVar10));
  if (bVar3 != false) {
    return;
  }
  local_38 = (pRVar5->MomentumFlux).data_;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x18);
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 3;
  *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 0.0;
  RVar4 = (this->super_RNEMD).rnemdFluxType_;
  pdVar7 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (RVar4 != rnemdPx) {
    if (RVar4 == rnemdPy) {
      pdVar7 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
    }
    else {
      if (RVar4 != rnemdPz) goto LAB_00272261;
      pdVar7 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 2;
    }
  }
  *pdVar7 = local_38;
LAB_00272261:
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  RNEMD::setMomentumFluxVector(&this->super_RNEMD,&local_58);
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

NIVSMethod::NIVSMethod(SimInfo* info, ForceManager* forceMan) :
      RNEMD {info, forceMan} {
    rnemdMethodLabel_ = "NIVS";

    RNEMDParameters* rnemdParams = info->getSimParams()->getRNEMDParameters();

    bool hasKineticFlux  = rnemdParams->haveKineticFlux();
    bool hasMomentumFlux = rnemdParams->haveMomentumFlux();

    bool methodFluxMismatch = false;
    bool hasCorrectFlux     = false;

    switch (rnemdFluxType_) {
    case rnemdKE:
    case rnemdRotKE:
    case rnemdFullKE:
      hasCorrectFlux = hasKineticFlux;
      break;
    case rnemdPx:
    case rnemdPy:
    case rnemdPz:
      hasCorrectFlux = hasMomentumFlux;
      break;
    case rnemdKePx:
    case rnemdKePy:
      hasCorrectFlux = hasMomentumFlux && hasKineticFlux;
      break;
    default:
      methodFluxMismatch = true;
      break;
    }

    if (methodFluxMismatch) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method,\n"
               "\t\tNIVS\n"
               "\tcannot be used with the current flux type, %s\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (!hasCorrectFlux) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method, NIVS, and flux type, %s,\n"
               "\tdid not have the correct flux value specified. Options\n"
               "\tinclude: kineticFlux and momentumFlux.\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (hasKineticFlux) {
      setKineticFlux(rnemdParams->getKineticFlux());
    } else {
      setKineticFlux(0.0);
    }

    if (hasMomentumFlux) {
      RealType momentumFlux = rnemdParams->getMomentumFlux();
      std::vector<RealType> momentumFluxVector(3);

      switch (rnemdFluxType_) {
      case rnemdPx:
        momentumFluxVector[0] = momentumFlux;
        break;
      case rnemdPy:
        momentumFluxVector[1] = momentumFlux;
        break;
      case rnemdPz:
        momentumFluxVector[2] = momentumFlux;
        break;
      default:
        break;
      }

      setMomentumFluxVector(momentumFluxVector);
    }
  }